

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string_view __thiscall
RenX_ServerListPlugin::getListServerAddress(RenX_ServerListPlugin *this,Server *server)

{
  string *this_00;
  long lVar1;
  __sv_type _Var2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  size_t local_70;
  char *local_68;
  Config *section;
  char *local_30;
  Server *server_local;
  RenX_ServerListPlugin *this_local;
  string_view serverHostname;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this_00 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  section = (Config *)_Var2._M_len;
  this_local = (RenX_ServerListPlugin *)section;
  local_30 = _Var2._M_str;
  serverHostname._M_len = (size_t)local_30;
  lVar1 = Jupiter::Config::getSection(&this->field_0x38,section,local_30);
  sVar4._M_str = (char *)serverHostname._M_len;
  sVar4._M_len = (size_t)this_local;
  if (lVar1 != 0) {
    bVar3 = sv("ListAddress",0xb);
    local_70 = bVar3._M_len;
    local_68 = bVar3._M_str;
    sVar4 = (string_view)
            Jupiter::Config::get(lVar1,local_70,local_68,this_local,serverHostname._M_len);
  }
  return sVar4;
}

Assistant:

std::string_view RenX_ServerListPlugin::getListServerAddress(const RenX::Server& server) {
	std::string_view serverHostname;
	serverHostname = server.getSocketHostname();

	if (auto section = config.getSection(serverHostname)) {
		serverHostname = section->get("ListAddress"sv, serverHostname);
	}

	return serverHostname;
}